

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-parser-test-suite.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [4];
  int iVar2;
  undefined1 local_268 [4];
  yaml_event_type_t type;
  yaml_event_t event;
  yaml_parser_t parser;
  FILE *input;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    parser.document = _stdin;
  }
  else {
    if (argc != 2) {
      fprintf(_stderr,"Usage: libyaml-parser [<input-file>]\n");
      return 1;
    }
    parser.document = (yaml_document_t *)fopen(argv[1],"rb");
  }
  if (parser.document == (yaml_document_t *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-parser-test-suite.c"
                  ,0x16,"int main(int, char **)");
  }
  iVar2 = yaml_parser_initialize((yaml_parser_t *)&event.end_mark.column);
  if (iVar2 == 0) {
    fprintf(_stderr,"Could not initialize the parser object\n");
    argv_local._4_4_ = 1;
  }
  else {
    yaml_parser_set_input_file((yaml_parser_t *)&event.end_mark.column,(FILE *)parser.document);
    do {
      iVar2 = yaml_parser_parse((yaml_parser_t *)&event.end_mark.column,(yaml_event_t *)local_268);
      auVar1 = local_268;
      if (iVar2 == 0) {
        fprintf(_stderr,"Parse error: %s\n",parser._0_8_);
        return 1;
      }
      if (local_268 == (undefined1  [4])0x0) {
        printf("???\n");
      }
      else if (local_268 == (undefined1  [4])0x1) {
        printf("+STR\n");
      }
      else if (local_268 == (undefined1  [4])0x2) {
        printf("-STR\n");
      }
      else if (local_268 == (undefined1  [4])0x3) {
        printf("+DOC");
        if (event.data.sequence_start.implicit == 0) {
          printf(" ---");
        }
        printf("\n");
      }
      else if (local_268 == (undefined1  [4])0x4) {
        printf("-DOC");
        if (event.type == YAML_NO_EVENT) {
          printf(" ...");
        }
        printf("\n");
      }
      else if (local_268 == (undefined1  [4])0x9) {
        printf("+MAP");
        if (CONCAT44(event._4_4_,event.type) != 0) {
          printf(" &%s",CONCAT44(event._4_4_,event.type));
        }
        if (event.data.document_start.version_directive != (yaml_version_directive_t *)0x0) {
          printf(" <%s>",event.data.document_start.version_directive);
        }
        printf("\n");
      }
      else if (local_268 == (undefined1  [4])0xa) {
        printf("-MAP\n");
      }
      else if (local_268 == (undefined1  [4])0x7) {
        printf("+SEQ");
        if (CONCAT44(event._4_4_,event.type) != 0) {
          printf(" &%s",CONCAT44(event._4_4_,event.type));
        }
        if (event.data.document_start.version_directive != (yaml_version_directive_t *)0x0) {
          printf(" <%s>",event.data.document_start.version_directive);
        }
        printf("\n");
      }
      else if (local_268 == (undefined1  [4])0x8) {
        printf("-SEQ\n");
      }
      else if (local_268 == (undefined1  [4])0x6) {
        printf("=VAL");
        if (CONCAT44(event._4_4_,event.type) != 0) {
          printf(" &%s",CONCAT44(event._4_4_,event.type));
        }
        if (event.data.document_start.version_directive != (yaml_version_directive_t *)0x0) {
          printf(" <%s>",event.data.document_start.version_directive);
        }
        switch(event.data.scalar.plain_implicit) {
        case 0:
          abort();
        case 1:
          printf(" :");
          break;
        case 2:
          printf(" \'");
          break;
        case 3:
          printf(" \"");
          break;
        case 4:
          printf(" |");
          break;
        case 5:
          printf(" >");
        }
        print_escaped(event.data.scalar.tag,
                      CONCAT44(event.data.sequence_start.style,event.data.sequence_start.implicit));
        printf("\n");
      }
      else {
        if (local_268 != (undefined1  [4])0x5) {
          abort();
        }
        printf("=ALI *%s\n",CONCAT44(event._4_4_,event.type));
      }
      yaml_event_delete((yaml_event_t *)local_268);
    } while (auVar1 != (undefined1  [4])0x2);
    iVar2 = fclose((FILE *)parser.document);
    if (iVar2 != 0) {
      __assert_fail("!fclose(input)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-parser-test-suite.c"
                    ,0x73,"int main(int, char **)");
    }
    yaml_parser_delete((yaml_parser_t *)&event.end_mark.column);
    fflush(_stdout);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *input;
    yaml_parser_t parser;
    yaml_event_t event;

    if (argc == 1)
        input = stdin;
    else if (argc == 2)
        input = fopen(argv[1], "rb");
    else {
        fprintf(stderr, "Usage: libyaml-parser [<input-file>]\n");
        return 1;
    }
    assert(input);

    if (!yaml_parser_initialize(&parser)) {
        fprintf(stderr, "Could not initialize the parser object\n");
        return 1;
    }
    yaml_parser_set_input_file(&parser, input);

    while (1) {
        yaml_event_type_t type;
        if (!yaml_parser_parse(&parser, &event)) {
            fprintf(stderr, "Parse error: %s\n", parser.problem);
            return 1;
        }
        type = event.type;

        if (type == YAML_NO_EVENT)
            printf("???\n");
        else if (type == YAML_STREAM_START_EVENT)
            printf("+STR\n");
        else if (type == YAML_STREAM_END_EVENT)
            printf("-STR\n");
        else if (type == YAML_DOCUMENT_START_EVENT) {
            printf("+DOC");
            if (!event.data.document_start.implicit)
                printf(" ---");
            printf("\n");
        }
        else if (type == YAML_DOCUMENT_END_EVENT) {
            printf("-DOC");
            if (!event.data.document_end.implicit)
                printf(" ...");
            printf("\n");
        }
        else if (type == YAML_MAPPING_START_EVENT) {
            printf("+MAP");
            if (event.data.mapping_start.anchor)
                printf(" &%s", event.data.mapping_start.anchor);
            if (event.data.mapping_start.tag)
                printf(" <%s>", event.data.mapping_start.tag);
            printf("\n");
        }
        else if (type == YAML_MAPPING_END_EVENT)
            printf("-MAP\n");
        else if (type == YAML_SEQUENCE_START_EVENT) {
            printf("+SEQ");
            if (event.data.sequence_start.anchor)
                printf(" &%s", event.data.sequence_start.anchor);
            if (event.data.sequence_start.tag)
                printf(" <%s>", event.data.sequence_start.tag);
            printf("\n");
        }
        else if (type == YAML_SEQUENCE_END_EVENT)
            printf("-SEQ\n");
        else if (type == YAML_SCALAR_EVENT) {
            printf("=VAL");
            if (event.data.scalar.anchor)
                printf(" &%s", event.data.scalar.anchor);
            if (event.data.scalar.tag)
                printf(" <%s>", event.data.scalar.tag);
            switch (event.data.scalar.style) {
            case YAML_PLAIN_SCALAR_STYLE:
                printf(" :");
                break;
            case YAML_SINGLE_QUOTED_SCALAR_STYLE:
                printf(" '");
                break;
            case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
                printf(" \"");
                break;
            case YAML_LITERAL_SCALAR_STYLE:
                printf(" |");
                break;
            case YAML_FOLDED_SCALAR_STYLE:
                printf(" >");
                break;
            case YAML_ANY_SCALAR_STYLE:
                abort();
            }
            print_escaped(event.data.scalar.value, event.data.scalar.length);
            printf("\n");
        }
        else if (type == YAML_ALIAS_EVENT)
            printf("=ALI *%s\n", event.data.alias.anchor);
        else
            abort();

        yaml_event_delete(&event);

        if (type == YAML_STREAM_END_EVENT)
            break;
    }

    assert(!fclose(input));
    yaml_parser_delete(&parser);
    fflush(stdout);

    return 0;
}